

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall args::Group::Match<char>(Group *this,char *flag)

{
  pointer ppBVar1;
  Base *pBVar2;
  long *plVar3;
  FlagBase *pFVar4;
  Group *this_00;
  pointer ppBVar5;
  
  ppBVar5 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  do {
    if (ppBVar5 == ppBVar1) {
      return (FlagBase *)0x0;
    }
    pBVar2 = *ppBVar5;
    if (pBVar2 != (Base *)0x0) {
      plVar3 = (long *)__dynamic_cast(pBVar2,&Base::typeinfo,&FlagBase::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        this_00 = (Group *)__dynamic_cast(pBVar2,&Base::typeinfo,&typeinfo,0);
        if (this_00 == (Group *)0x0) goto LAB_001109d2;
        pFVar4 = Match<char>(this_00,flag);
      }
      else {
        pFVar4 = (FlagBase *)(**(code **)(*plVar3 + 0x38))(plVar3,(int)*flag);
      }
      if (pFVar4 != (FlagBase *)0x0) {
        return pFVar4;
      }
    }
LAB_001109d2:
    ppBVar5 = ppBVar5 + 1;
  } while( true );
}

Assistant:

FlagBase *Match(const T &flag)
            {
                for (Base *child: children)
                {
                    if (FlagBase *flagBase = dynamic_cast<FlagBase *>(child))
                    {
                        if (FlagBase *match = flagBase->Match(flag))
                        {
                            return match;
                        }
                    } else if (Group *group = dynamic_cast<Group *>(child))
                    {
                        if (FlagBase *match = group->Match(flag))
                        {
                            return match;
                        }
                    }
                }
                return nullptr;
            }